

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological-sort.cpp
# Opt level: O3

void __thiscall
MinTopologicalSortTest_SortStrings_Test::~MinTopologicalSortTest_SortStrings_Test
          (MinTopologicalSortTest_SortStrings_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MinTopologicalSortTest, SortStrings) {
  std::map<std::string, std::vector<std::string>> graph{
    {"animal", {"mammal"}},
    {"cat", {}},
    {"dog", {}},
    {"mammal", {"cat", "dog"}}};
  std::vector<std::string> expected{"animal", "mammal", "cat", "dog"};
  EXPECT_EQ(TopologicalSort::sortOf(graph.begin(), graph.end()), expected);
}